

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseDefaultDecl(xmlParserCtxtPtr ctxt,xmlChar **value)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  int iVar3;
  xmlChar *pxVar4;
  int iVar5;
  
  *value = (xmlChar *)0x0;
  pxVar2 = ctxt->input;
  pxVar4 = pxVar2->cur;
  iVar5 = 1;
  if (*pxVar4 == '#') {
    xVar1 = pxVar4[1];
    if (xVar1 == 'F') {
      if (((pxVar4[2] == 'I') && (pxVar4[3] == 'X')) && ((pxVar4[4] == 'E' && (pxVar4[5] == 'D'))))
      {
        pxVar2->cur = pxVar4 + 6;
        pxVar2->col = pxVar2->col + 6;
        if (pxVar4[6] == '\0') {
          xmlParserGrow(ctxt);
        }
        iVar3 = xmlSkipBlankCharsPE(ctxt);
        iVar5 = 4;
        if (iVar3 == 0) {
          xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'#FIXED\'\n");
        }
      }
    }
    else if (xVar1 == 'I') {
      if (((((pxVar4[2] == 'M') && (pxVar4[3] == 'P')) && (pxVar4[4] == 'L')) &&
          ((pxVar4[5] == 'I' && (pxVar4[6] == 'E')))) && (pxVar4[7] == 'D')) {
        pxVar2->cur = pxVar4 + 8;
        pxVar2->col = pxVar2->col + 8;
        iVar5 = 3;
        xVar1 = pxVar4[8];
        goto joined_r0x00137850;
      }
    }
    else if ((((xVar1 == 'R') && (pxVar4[2] == 'E')) &&
             ((pxVar4[3] == 'Q' &&
              (((pxVar4[4] == 'U' && (pxVar4[5] == 'I')) && (pxVar4[6] == 'R')))))) &&
            ((pxVar4[7] == 'E' && (pxVar4[8] == 'D')))) {
      pxVar2->cur = pxVar4 + 9;
      pxVar2->col = pxVar2->col + 9;
      iVar5 = 2;
      xVar1 = pxVar4[9];
joined_r0x00137850:
      if (xVar1 != '\0') {
        return iVar5;
      }
      xmlParserGrow(ctxt);
      return iVar5;
    }
  }
  pxVar4 = xmlParseAttValue(ctxt);
  if (pxVar4 == (xmlChar *)0x0) {
    xmlFatalErrMsg(ctxt,ctxt->errNo,"Attribute default value declaration error\n");
  }
  else {
    *value = pxVar4;
  }
  return iVar5;
}

Assistant:

int
xmlParseDefaultDecl(xmlParserCtxtPtr ctxt, xmlChar **value) {
    int val;
    xmlChar *ret;

    *value = NULL;
    if (CMP9(CUR_PTR, '#', 'R', 'E', 'Q', 'U', 'I', 'R', 'E', 'D')) {
	SKIP(9);
	return(XML_ATTRIBUTE_REQUIRED);
    }
    if (CMP8(CUR_PTR, '#', 'I', 'M', 'P', 'L', 'I', 'E', 'D')) {
	SKIP(8);
	return(XML_ATTRIBUTE_IMPLIED);
    }
    val = XML_ATTRIBUTE_NONE;
    if (CMP6(CUR_PTR, '#', 'F', 'I', 'X', 'E', 'D')) {
	SKIP(6);
	val = XML_ATTRIBUTE_FIXED;
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after '#FIXED'\n");
	}
    }
    ret = xmlParseAttValue(ctxt);
    if (ret == NULL) {
	xmlFatalErrMsg(ctxt, (xmlParserErrors)ctxt->errNo,
		       "Attribute default value declaration error\n");
    } else
        *value = ret;
    return(val);
}